

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata.cc
# Opt level: O0

void __thiscall Funcdata::clearCallSpecs(Funcdata *this)

{
  FuncCallSpecs *this_00;
  size_type sVar1;
  reference ppFVar2;
  int local_14;
  int4 i;
  Funcdata *this_local;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::size(&this->qlst);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppFVar2 = std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::operator[]
                        (&this->qlst,(long)local_14);
    this_00 = *ppFVar2;
    if (this_00 != (FuncCallSpecs *)0x0) {
      FuncCallSpecs::~FuncCallSpecs(this_00);
      operator_delete(this_00);
    }
    local_14 = local_14 + 1;
  }
  std::vector<FuncCallSpecs_*,_std::allocator<FuncCallSpecs_*>_>::clear(&this->qlst);
  return;
}

Assistant:

void Funcdata::clearCallSpecs(void)

{
  int4 i;

  for(i=0;i<qlst.size();++i)
    delete qlst[i];		// Delete each func_callspec

  qlst.clear();			// Delete list of pointers
}